

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memdbLock(sqlite3_file *pFile,int eLock)

{
  sqlite3_io_methods *psVar1;
  bool bVar2;
  int iVar3;
  
  if (*(int *)&pFile[2].pMethods == eLock) {
    return 0;
  }
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
  }
  if (eLock < 2) {
    if (eLock == 1) {
      if (*(int *)&pFile[2].pMethods < 2) {
        if (*(int *)((long)&psVar1->xFileSize + 4) != 0) goto LAB_001293df;
        *(int *)&psVar1->xFileSize = *(int *)&psVar1->xFileSize + 1;
      }
      else {
        *(undefined4 *)((long)&psVar1->xFileSize + 4) = 0;
      }
    }
    else {
      if (1 < *(int *)&pFile[2].pMethods) {
        *(undefined4 *)((long)&psVar1->xFileSize + 4) = 0;
      }
      *(int *)&psVar1->xFileSize = *(int *)&psVar1->xFileSize + -1;
    }
    iVar3 = 0;
    bVar2 = true;
  }
  else {
    iVar3 = 0;
    if (((ulong)psVar1->xSync & 0x400000000) == 0) {
      bVar2 = true;
      if (1 < *(int *)&pFile[2].pMethods) goto LAB_001293e6;
      iVar3 = 0;
      if (*(int *)((long)&psVar1->xFileSize + 4) == 0) {
        *(undefined4 *)((long)&psVar1->xFileSize + 4) = 1;
        goto LAB_001293e6;
      }
LAB_001293df:
      iVar3 = 5;
    }
    else {
      iVar3 = 8;
    }
    bVar2 = false;
  }
LAB_001293e6:
  if (bVar2) {
    *(int *)&pFile[2].pMethods = eLock;
  }
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar1->xTruncate);
  }
  return iVar3;
}

Assistant:

static int memdbLock(sqlite3_file *pFile, int eLock){
  MemFile *pThis = (MemFile*)pFile;
  MemStore *p = pThis->pStore;
  int rc = SQLITE_OK;
  if( eLock==pThis->eLock ) return SQLITE_OK;
  memdbEnter(p);
  if( eLock>SQLITE_LOCK_SHARED ){
    if( p->mFlags & SQLITE_DESERIALIZE_READONLY ){
      rc = SQLITE_READONLY;
    }else if( pThis->eLock<=SQLITE_LOCK_SHARED ){
      if( p->nWrLock ){
        rc = SQLITE_BUSY;
      }else{
        p->nWrLock = 1;
      }
    }
  }else if( eLock==SQLITE_LOCK_SHARED ){
    if( pThis->eLock > SQLITE_LOCK_SHARED ){
      assert( p->nWrLock==1 );
      p->nWrLock = 0;
    }else if( p->nWrLock ){
      rc = SQLITE_BUSY;
    }else{
      p->nRdLock++;
    }
  }else{
    assert( eLock==SQLITE_LOCK_NONE );
    if( pThis->eLock>SQLITE_LOCK_SHARED ){
      assert( p->nWrLock==1 );
      p->nWrLock = 0;
    }
    assert( p->nRdLock>0 );
    p->nRdLock--;
  }
  if( rc==SQLITE_OK ) pThis->eLock = eLock;
  memdbLeave(p);
  return rc;
}